

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O1

void __thiscall myutils::IpcConnection::IpcConnection(IpcConnection *this)

{
  MessageLoop *this_00;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->super_Connection)._vptr_Connection = (_func_int **)&PTR__Connection_0015e950;
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection)._vptr_Connection = (_func_int **)&PTR__IpcConnection_0015e868;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&PTR__IpcConnection_0015e8b8;
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  (this->m_send_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_send_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_send_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_send_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_send_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_callback = (Connection_Callback *)0x0;
  this->m_should_exit = false;
  this->m_connected = false;
  this->m_my_id = 0;
  this->m_my_shmem = (FileMapping *)0x0;
  this->m_svr_shmem = (FileMapping *)0x0;
  this->m_recv_queue = (ShmemQueue *)0x0;
  this->m_send_queue = (ShmemQueue *)0x0;
  this->m_recv_thread = (thread *)0x0;
  this->m_slot_info = (ConnectionSlotInfo *)0x0;
  this->m_slot = (ConnectionSlot *)0x0;
  this->m_sem_send = (SharedSemaphore *)0x0;
  this->m_sem_recv = (SharedSemaphore *)0x0;
  (this->m_last_connect_time).__d.__r = 0;
  this->m_socket = -1;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  this_00 = &(this->super_MsgLoopRun).m_msg_loop;
  *(code **)local_58._M_unused._0_8_ = check_connection;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(IpcConnection **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>_>
             ::_M_manager;
  loop::MessageLoop::post_delayed_task(this_00,(Closure *)&local_58,500);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = on_idle_timer;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(IpcConnection **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>_>
             ::_M_manager;
  loop::MessageLoop::post_delayed_task(this_00,(Closure *)&local_58,1000);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

IpcConnection::IpcConnection()
    : m_callback(nullptr)
    , m_should_exit(false)
    , m_connected(false)
    , m_my_id(0)
    , m_my_shmem(nullptr)
    , m_svr_shmem(nullptr)
    , m_recv_queue(nullptr)
    , m_send_queue(nullptr)
    , m_recv_thread(nullptr)
    , m_slot_info(nullptr)
    , m_slot(nullptr)
    , m_sem_send(nullptr)
    , m_sem_recv(nullptr)
    , m_socket(INVALID_SOCKET)
{
    m_msg_loop.post_delayed_task(bind(&IpcConnection::check_connection, this),  500);
    m_msg_loop.post_delayed_task(bind(&IpcConnection::on_idle_timer,    this), 1000);
}